

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UtcTimeStampTestCase.cpp
# Opt level: O1

void __thiscall SuiteUtcTimeStampTests::TestaddSeconds::~TestaddSeconds(TestaddSeconds *this)

{
  UnitTest::Test::~Test(&this->super_Test);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(addSeconds)
{
  UtcTimeStamp time( 10, 10, 10, 10, 10, 2000 );
  time += DateTime::SECONDS_PER_DAY;
  CHECK_EQUAL( 10, time.getHour() );
  CHECK_EQUAL( 10, time.getMinute() );
  CHECK_EQUAL( 10, time.getSecond() );
  CHECK_EQUAL( 11, time.getDate() );
  CHECK_EQUAL( 10, time.getMonth() );
  CHECK_EQUAL( 2000, time.getYear() );
}